

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonParser.cpp
# Opt level: O0

void json::JsonParser::parseObject(istream *input,JsonObject *parent)

{
  runtime_error *this;
  JsonToken local_d0;
  JsonToken local_a8;
  JsonToken local_80;
  undefined4 local_44;
  undefined1 local_40 [8];
  JsonToken current;
  JsonObject *parent_local;
  istream *input_local;
  
  current._32_8_ = parent;
  JsonLexer::nextToken((JsonToken *)local_40,input);
  if (local_40._0_4_ == EndObject) {
    local_44 = 1;
  }
  else {
    parseObjectMember(input,(JsonToken *)local_40,(JsonObject *)current._32_8_);
    JsonLexer::nextToken(&local_80,input);
    JsonToken::operator=((JsonToken *)local_40,&local_80);
    JsonToken::~JsonToken(&local_80);
    while (local_40._0_4_ == ValueSeparator) {
      JsonLexer::nextToken(&local_a8,input);
      JsonToken::operator=((JsonToken *)local_40,&local_a8);
      JsonToken::~JsonToken(&local_a8);
      parseObjectMember(input,(JsonToken *)local_40,(JsonObject *)current._32_8_);
      JsonLexer::nextToken(&local_d0,input);
      JsonToken::operator=((JsonToken *)local_40,&local_d0);
      JsonToken::~JsonToken(&local_d0);
    }
    if (local_40._0_4_ != EndObject) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Could not read the end of the object");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_44 = 0;
  }
  JsonToken::~JsonToken((JsonToken *)local_40);
  return;
}

Assistant:

void JsonParser::parseObject(std::istream &input, JsonObject &parent)
    {
        JsonToken current = JsonLexer::nextToken(input);

        if (current.type == JsonTokenType::EndObject)
            return;

        parseObjectMember(input, current, parent);
        current = JsonLexer::nextToken(input);

        while (current.type == JsonTokenType::ValueSeparator)
        {
            current = JsonLexer::nextToken(input);
            parseObjectMember(input, current, parent);
            current = JsonLexer::nextToken(input);
        }

        if (current.type != JsonTokenType::EndObject)
            throw std::runtime_error("Could not read the end of the object");
    }